

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.hpp
# Opt level: O3

ostream * lest::operator<<(ostream *os,optional<long> *v)

{
  ostream *poVar1;
  long *value;
  string local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[optional:",10);
  if ((v->super__Optional_base<long,_true,_true>)._M_payload.super__Optional_payload_base<long>.
      _M_engaged == true) {
    string_maker<long>::to_string_abi_cxx11_(&local_30,(string_maker<long> *)v,value);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"[empty]","");
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::optional<T> const & v )
{
    using lest::to_string;
    return os << "[optional:" << (v ? to_string(*v) : "[empty]") << "]";
}